

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O0

FT_Error parse_dict(T1_Face face,T1_Loader loader,FT_Byte *base,FT_ULong size)

{
  char *__s;
  int iVar1;
  uint uVar2;
  FT_Error FVar3;
  size_t sVar4;
  FT_UInt dict;
  FT_Byte *name;
  T1_Field keyword;
  FT_UInt len;
  FT_Byte *b_1;
  FT_ULong s_1;
  FT_Byte *b;
  FT_ULong s;
  FT_Byte *cur;
  FT_ULong FStack_48;
  FT_Bool have_integer;
  FT_Byte *start_binary;
  FT_Byte *limit;
  T1_Parser parser;
  FT_ULong size_local;
  FT_Byte *base_local;
  T1_Loader loader_local;
  T1_Face face_local;
  
  FStack_48 = 0;
  cur._7_1_ = '\0';
  (loader->parser).root.cursor = base;
  (loader->parser).root.limit = base + size;
  (loader->parser).root.error = 0;
  start_binary = (loader->parser).root.limit;
  limit = (FT_Byte *)loader;
  parser = (T1_Parser)size;
  size_local = (FT_ULong)base;
  base_local = (FT_Byte *)loader;
  loader_local = (T1_Loader)face;
  (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
  while (((*(FT_Byte **)limit < start_binary &&
          ((s = *(FT_ULong *)limit, *(char *)s != 'e' ||
           ((((FT_Byte *)(s + 6) != start_binary &&
             ((start_binary <= (FT_Byte *)(s + 6) ||
              ((((((((*(char *)(s + 5) != ' ' && (*(char *)(s + 5) != '\r')) &&
                    (*(char *)(s + 5) != '\n')) &&
                   ((*(char *)(s + 5) != '\t' && (*(char *)(s + 5) != '\f')))) &&
                  (*(char *)(s + 5) != '\0')) &&
                 (((*(char *)(s + 5) != '/' && (*(char *)(s + 5) != '(')) &&
                  ((*(char *)(s + 5) != ')' &&
                   (((*(char *)(s + 5) != '<' && (*(char *)(s + 5) != '>')) &&
                    (*(char *)(s + 5) != '[')))))))) &&
                ((*(char *)(s + 5) != ']' && (*(char *)(s + 5) != '{')))) &&
               ((*(char *)(s + 5) != '}' && (*(char *)(s + 5) != '%')))))))) ||
            (iVar1 = strncmp((char *)s,"eexec",5), iVar1 != 0)))))) &&
         ((*(char *)s != 'c' ||
          ((((FT_Byte *)(s + 10) != start_binary &&
            ((start_binary <= (FT_Byte *)(s + 10) ||
             (((((*(char *)(s + 9) != ' ' && (*(char *)(s + 9) != '\r')) &&
                ((*(char *)(s + 9) != '\n' &&
                 (((*(char *)(s + 9) != '\t' && (*(char *)(s + 9) != '\f')) &&
                  (*(char *)(s + 9) != '\0')))))) &&
               ((*(char *)(s + 9) != '/' && (*(char *)(s + 9) != '(')))) &&
              ((*(char *)(s + 9) != ')' &&
               (((*(char *)(s + 9) != '<' && (*(char *)(s + 9) != '>')) &&
                ((*(char *)(s + 9) != '[' &&
                 ((((*(char *)(s + 9) != ']' && (*(char *)(s + 9) != '{')) &&
                   (*(char *)(s + 9) != '}')) && (*(char *)(s + 9) != '%')))))))))))))) ||
           (iVar1 = strncmp((char *)s,"closefile",9), iVar1 != 0))))))) {
    if ((*(char *)s == 'F') &&
       ((((FT_Byte *)(s + 0xe) == start_binary ||
         (((FT_Byte *)(s + 0xe) < start_binary &&
          ((((*(char *)(s + 0xd) == ' ' || (*(char *)(s + 0xd) == '\r')) ||
            ((*(char *)(s + 0xd) == '\n' ||
             ((*(char *)(s + 0xd) == '\t' || (*(char *)(s + 0xd) == '\f')))))) ||
           ((((*(char *)(s + 0xd) == '\0' ||
              (((*(char *)(s + 0xd) == '/' || (*(char *)(s + 0xd) == '(')) ||
               (*(char *)(s + 0xd) == ')')))) ||
             ((((*(char *)(s + 0xd) == '<' || (*(char *)(s + 0xd) == '>')) ||
               ((*(char *)(s + 0xd) == '[' ||
                ((*(char *)(s + 0xd) == ']' || (*(char *)(s + 0xd) == '{')))))) ||
              (*(char *)(s + 0xd) == '}')))) || (*(char *)(s + 0xd) == '%')))))))) &&
        (iVar1 = strncmp((char *)s,"FontDirectory",0xd), iVar1 == 0)))) {
      if ((*(uint *)(base_local + 0x2c4) & 1) != 0) {
        *(uint *)(base_local + 0x2c4) = *(uint *)(base_local + 0x2c4) | 2;
      }
      *(long *)limit = *(long *)limit + 0xd;
    }
    else if (*(byte *)s - 0x30 < 10) {
      FStack_48 = s;
      (**(code **)(limit + 0x40))(limit);
      if (*(int *)(limit + 0x18) != 0) break;
      cur._7_1_ = '\x01';
    }
    else {
      if ((((*(char *)s == 'R') && ((FT_Byte *)(s + 6) < start_binary)) && (*(char *)(s + 1) == 'D')
          ) && (cur._7_1_ != '\0')) {
        *(FT_ULong *)limit = FStack_48;
        iVar1 = read_binary_data((T1_Parser)limit,(FT_ULong *)&b,(FT_Byte **)&s_1,
                                 (loader_local->encoding_table).elements[0xd] != (FT_Byte *)0x0);
        if (iVar1 == 0) {
          return 3;
        }
      }
      else if (((*(char *)s == '-') && ((FT_Byte *)(s + 6) < start_binary)) &&
              ((*(char *)(s + 1) == '|' && (cur._7_1_ != '\0')))) {
        *(FT_ULong *)limit = FStack_48;
        iVar1 = read_binary_data((T1_Parser)limit,(FT_ULong *)&b_1,
                                 (FT_Byte **)&stack0xffffffffffffff88,
                                 (loader_local->encoding_table).elements[0xd] != (FT_Byte *)0x0);
        if (iVar1 == 0) {
          return 3;
        }
      }
      else if ((*(char *)s == '/') && ((FT_Byte *)(s + 2) < start_binary)) {
        s = s + 1;
        *(FT_ULong *)limit = s;
        (**(code **)(limit + 0x40))(limit);
        if (*(int *)(limit + 0x18) != 0) break;
        uVar2 = (int)*(undefined8 *)limit - (int)s;
        if (((uVar2 != 0) && (uVar2 < 0x16)) && (*(FT_Byte **)limit < start_binary)) {
          for (name = (FT_Byte *)t1_keywords; __s = *(char **)name, __s != (char *)0x0;
              name = name + 0x30) {
            if (((*(char *)s == *__s) && (sVar4 = strlen(__s), uVar2 == sVar4)) &&
               (iVar1 = memcmp((void *)s,__s,(ulong)uVar2), iVar1 == 0)) {
              uVar2 = 1;
              if ((*(uint *)(base_local + 0x2c4) & 1) != 0) {
                uVar2 = 2;
              }
              if (((uVar2 & *(uint *)(name + 0x28)) != 0) &&
                 (((*(uint *)(base_local + 0x2c4) & 2) == 0 ||
                  (iVar1 = strcmp(__s,"CharStrings"), iVar1 == 0)))) {
                FVar3 = t1_load_keyword((T1_Face)loader_local,(T1_Loader)base_local,(T1_Field)name);
                *(FT_Error *)(limit + 0x18) = FVar3;
                if (*(int *)(limit + 0x18) != 0) {
                  if ((*(uint *)(limit + 0x18) & 0xff) != 0xa2) {
                    return *(FT_Error *)(limit + 0x18);
                  }
                  limit[0x18] = '\0';
                  limit[0x19] = '\0';
                  limit[0x1a] = '\0';
                  limit[0x1b] = '\0';
                }
              }
              break;
            }
          }
        }
      }
      else {
        (**(code **)(limit + 0x40))(limit);
        if (*(int *)(limit + 0x18) != 0) break;
      }
      cur._7_1_ = '\0';
    }
    (**(code **)(limit + 0x38))(limit);
  }
  return *(FT_Error *)(limit + 0x18);
}

Assistant:

static FT_Error
  parse_dict( T1_Face    face,
              T1_Loader  loader,
              FT_Byte*   base,
              FT_ULong   size )
  {
    T1_Parser  parser = &loader->parser;
    FT_Byte   *limit, *start_binary = NULL;
    FT_Bool    have_integer = 0;


    parser->root.cursor = base;
    parser->root.limit  = base + size;
    parser->root.error  = FT_Err_Ok;

    limit = parser->root.limit;

    T1_Skip_Spaces( parser );

    while ( parser->root.cursor < limit )
    {
      FT_Byte*  cur;


      cur = parser->root.cursor;

      /* look for `eexec' */
      if ( IS_PS_TOKEN( cur, limit, "eexec" ) )
        break;

      /* look for `closefile' which ends the eexec section */
      else if ( IS_PS_TOKEN( cur, limit, "closefile" ) )
        break;

      /* in a synthetic font the base font starts after a           */
      /* `FontDictionary' token that is placed after a Private dict */
      else if ( IS_PS_TOKEN( cur, limit, "FontDirectory" ) )
      {
        if ( loader->keywords_encountered & T1_PRIVATE )
          loader->keywords_encountered |=
            T1_FONTDIR_AFTER_PRIVATE;
        parser->root.cursor += 13;
      }

      /* check whether we have an integer */
      else if ( ft_isdigit( *cur ) )
      {
        start_binary = cur;
        T1_Skip_PS_Token( parser );
        if ( parser->root.error )
          goto Exit;
        have_integer = 1;
      }

      /* in valid Type 1 fonts we don't see `RD' or `-|' directly */
      /* since those tokens are handled by parse_subrs and        */
      /* parse_charstrings                                        */
      else if ( *cur == 'R' && cur + 6 < limit && *( cur + 1 ) == 'D' &&
                have_integer                                          )
      {
        FT_ULong  s;
        FT_Byte*  b;


        parser->root.cursor = start_binary;
        if ( !read_binary_data( parser, &s, &b, IS_INCREMENTAL ) )
          return FT_THROW( Invalid_File_Format );
        have_integer = 0;
      }

      else if ( *cur == '-' && cur + 6 < limit && *( cur + 1 ) == '|' &&
                have_integer                                          )
      {
        FT_ULong  s;
        FT_Byte*  b;


        parser->root.cursor = start_binary;
        if ( !read_binary_data( parser, &s, &b, IS_INCREMENTAL ) )
          return FT_THROW( Invalid_File_Format );
        have_integer = 0;
      }

      /* look for immediates */
      else if ( *cur == '/' && cur + 2 < limit )
      {
        FT_UInt  len;


        cur++;

        parser->root.cursor = cur;
        T1_Skip_PS_Token( parser );
        if ( parser->root.error )
          goto Exit;

        len = (FT_UInt)( parser->root.cursor - cur );

        if ( len > 0 && len < 22 && parser->root.cursor < limit )
        {
          /* now compare the immediate name to the keyword table */
          T1_Field  keyword = (T1_Field)t1_keywords;


          for (;;)
          {
            FT_Byte*  name;


            name = (FT_Byte*)keyword->ident;
            if ( !name )
              break;

            if ( cur[0] == name[0]                      &&
                 len == ft_strlen( (const char *)name ) &&
                 ft_memcmp( cur, name, len ) == 0       )
            {
              /* We found it -- run the parsing callback!     */
              /* We record every instance of every field      */
              /* (until we reach the base font of a           */
              /* synthetic font) to deal adequately with      */
              /* multiple master fonts; this is also          */
              /* necessary because later PostScript           */
              /* definitions override earlier ones.           */

              /* Once we encounter `FontDirectory' after      */
              /* `/Private', we know that this is a synthetic */
              /* font; except for `/CharStrings' we are not   */
              /* interested in anything that follows this     */
              /* `FontDirectory'.                             */

              /* MM fonts have more than one /Private token at */
              /* the top level; let's hope that all the junk   */
              /* that follows the first /Private token is not  */
              /* interesting to us.                            */

              /* According to Adobe Tech Note #5175 (CID-Keyed */
              /* Font Installation for ATM Software) a `begin' */
              /* must be followed by exactly one `end', and    */
              /* `begin' -- `end' pairs must be accurately     */
              /* paired.  We could use this to distinguish     */
              /* between the global Private and the Private    */
              /* dict that is a member of the Blend dict.      */

              const FT_UInt dict =
                ( loader->keywords_encountered & T1_PRIVATE )
                    ? T1_FIELD_DICT_PRIVATE
                    : T1_FIELD_DICT_FONTDICT;


              if ( !( dict & keyword->dict ) )
              {
                FT_TRACE1(( "parse_dict: found `%s' but ignoring it"
                            " since it is in the wrong dictionary\n",
                            keyword->ident ));
                break;
              }

              if ( !( loader->keywords_encountered &
                      T1_FONTDIR_AFTER_PRIVATE     )                  ||
                   ft_strcmp( (const char*)name, "CharStrings" ) == 0 )
              {
                parser->root.error = t1_load_keyword( face,
                                                      loader,
                                                      keyword );
                if ( parser->root.error )
                {
                  if ( FT_ERR_EQ( parser->root.error, Ignore ) )
                    parser->root.error = FT_Err_Ok;
                  else
                    return parser->root.error;
                }
              }
              break;
            }

            keyword++;
          }
        }

        have_integer = 0;
      }
      else
      {
        T1_Skip_PS_Token( parser );
        if ( parser->root.error )
          goto Exit;
        have_integer = 0;
      }

      T1_Skip_Spaces( parser );
    }

  Exit:
    return parser->root.error;
  }